

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O3

void __thiscall CSR::CSR(CSR *this,int r,int c,int nz,int *p,int *ind,double *x)

{
  int *__s;
  int *__s_00;
  double *__s_01;
  ulong __n;
  size_t __n_00;
  ulong __n_01;
  size_t __n_02;
  
  this->row = r;
  this->col = c;
  this->nonzero = nz;
  __n_00 = (ulong)(r + 1) << 2;
  __n_02 = __n_00;
  if (r < -1) {
    __n_02 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(__n_02);
  memset(__s,0,__n_02);
  this->ptr = __s;
  __n = (long)nz * 4;
  if (nz < 0) {
    __n = 0xffffffffffffffff;
  }
  __n_01 = (long)nz * 8;
  if (nz < 0) {
    __n_01 = 0xffffffffffffffff;
  }
  __s_00 = (int *)operator_new__(__n);
  memset(__s_00,0,__n);
  this->idx = __s_00;
  __s_01 = (double *)operator_new__(__n_01);
  memset(__s_01,0,__n_01);
  this->val = __s_01;
  if (-1 < r) {
    memcpy(__s,p,__n_00);
  }
  if (0 < nz) {
    memcpy(__s_00,ind,(ulong)(uint)nz * 4);
    memcpy(__s_01,x,(ulong)(uint)nz << 3);
    return;
  }
  return;
}

Assistant:

CSR::CSR(int r, int c, int nz, int *p, int *ind, double *x)
{
    row = r;
    col = c;
    nonzero = nz;
    ptr = new int[row+1]();
    idx = new int[nonzero]();
    val = new double[nonzero]();

    for(int i=0; i<row+1; i++)
    {
        ptr[i] = p[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        idx[i] = ind[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        val[i] = x[i];
    }

}